

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

SimpleString removeAllPrintableCharactersFrom(SimpleString *str)

{
  size_t sVar1;
  SimpleString *this;
  size_t extraout_RDX;
  SimpleString *in_RDI;
  SimpleString SVar2;
  size_t i;
  char *buffer;
  size_t bufferSize;
  SimpleString *result;
  char *in_stack_ffffffffffffffa8;
  SimpleString *this_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  char *in_stack_ffffffffffffffd8;
  ulong uVar3;
  
  this_00 = in_RDI;
  sVar1 = SimpleString::size((SimpleString *)0x1797c5);
  this = (SimpleString *)(*PlatformSpecificMalloc)(sVar1 + 1);
  SimpleString::copyToBuffer
            (this,in_stack_ffffffffffffffd8,
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  for (uVar3 = 0; uVar3 < sVar1; uVar3 = uVar3 + 1) {
    if ((*(char *)((long)&this->buffer_ + uVar3) != '\t') &&
       (*(char *)((long)&this->buffer_ + uVar3) != '\n')) {
      *(undefined1 *)((long)&this->buffer_ + uVar3) = 0x20;
    }
  }
  SimpleString::SimpleString(this_00,in_stack_ffffffffffffffa8);
  (*PlatformSpecificFree)(this);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

static SimpleString removeAllPrintableCharactersFrom(const SimpleString& str)
{
    size_t bufferSize = str.size()+1;
    char* buffer = (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);

    for (size_t i = 0; i < bufferSize-1; i++)
        if (buffer[i] != '\t' && buffer[i] != '\n')
            buffer[i] = ' ';

    SimpleString result(buffer);
    PlatformSpecificFree(buffer);
    return result;
}